

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O2

void Bmc_CexCareVerify(Aig_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t *pCexMin,int fVerbose)

{
  int iVar1;
  Gia_Man_t *p_00;
  char *__s;
  
  p_00 = Gia_ManFromAigSimple(p);
  if (fVerbose != 0) {
    printf("Original :    ");
    Bmc_CexPrint(pCex,p_00->vCis->nSize - p_00->nRegs,0);
    printf("Minimized:    ");
    Bmc_CexPrint(pCexMin,p_00->vCis->nSize - p_00->nRegs,0);
  }
  iVar1 = Bmc_CexVerify(p_00,pCex,pCexMin);
  __s = "Counter-example verification succeeded.";
  if (iVar1 == 0) {
    __s = "Counter-example verification has failed.";
  }
  puts(__s);
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Bmc_CexCareVerify( Aig_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t * pCexMin, int fVerbose )
{
    Gia_Man_t * pGia = Gia_ManFromAigSimple( p );
    if ( fVerbose )
    {
        printf( "Original :    " );
        Bmc_CexPrint( pCex, Gia_ManPiNum(pGia), 0 );
        printf( "Minimized:    " );
        Bmc_CexPrint( pCexMin, Gia_ManPiNum(pGia), 0 );
    }
    if ( !Bmc_CexVerify( pGia, pCex, pCexMin ) )
        printf( "Counter-example verification has failed.\n" );
    else 
        printf( "Counter-example verification succeeded.\n" );
    Gia_ManStop( pGia );
}